

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_LookupTable
          (LookupTableForm2 LookupTable,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  reference pvVar2;
  reference pvVar3;
  code *in_RDI;
  pair<double,_double> pVar4;
  uint32_t i;
  TimerContainer timer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> table;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  TimerContainer *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff38;
  TimerContainer *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  code *pcVar5;
  uint local_94;
  BaseTimerContainer *in_stack_ffffffffffffff90;
  undefined1 local_58 [28];
  uint32_t in_stack_ffffffffffffffc4;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  
  Test_Helper::uniformImages
            (in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x173d7d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (value_type_conflict2 *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x173da5);
  SetupFunction((string *)0x173db2);
  Performance_Test::TimerContainer::TimerContainer(in_stack_ffffffffffffff30);
  local_94 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= local_94) break;
    Performance_Test::TimerContainer::start(in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff40 = (TimerContainer *)(local_58 + 0x18);
    pcVar5 = in_RDI;
    pvVar2 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)in_stack_ffffffffffffff40,0);
    pvVar3 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)in_stack_ffffffffffffff40,1);
    (*pcVar5)(pvVar2,pvVar3,local_58);
    Performance_Test::TimerContainer::stop(in_stack_ffffffffffffff40);
    local_94 = local_94 + 1;
  }
  CleanupFunction((string *)0x173ebf);
  pVar4 = Performance_Test::BaseTimerContainer::mean(in_stack_ffffffffffffff90);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x173f01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff40);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_ffffffffffffff40);
  return pVar4;
}

Assistant:

std::pair < double, double > template_LookupTable( LookupTableForm2 LookupTable, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformImages( 2, size, size );
        std::vector<uint8_t> table(256, 0);

        TEST_FUNCTION_LOOP( LookupTable( image[0], image[1], table ), namespaceName )
    }